

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O2

bool __thiscall FSliderItem::MenuEvent(FSliderItem *this,int mkey,bool fromcontroller)

{
  int iVar1;
  FSoundID local_10;
  FSoundID local_c;
  
  if ((mkey == 6) || (mkey == 3)) {
    local_10.ID = S_FindSound("menu/change");
    S_Sound(0x22,&local_10,snd_menuvolume.Value,0.0);
    iVar1 = this->mSelection + this->mStep;
    if (this->mMaxrange <= iVar1) {
      iVar1 = this->mMaxrange;
    }
  }
  else {
    if (mkey != 2) {
      return false;
    }
    local_c.ID = S_FindSound("menu/change");
    S_Sound(0x22,&local_c,snd_menuvolume.Value,0.0);
    iVar1 = this->mSelection - this->mStep;
    if (iVar1 <= this->mMinrange) {
      iVar1 = this->mMinrange;
    }
  }
  this->mSelection = iVar1;
  return true;
}

Assistant:

bool FSliderItem::MenuEvent (int mkey, bool fromcontroller)
{
	if (mkey == MKEY_Left)
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/change", snd_menuvolume, ATTN_NONE);
		if ((mSelection -= mStep) < mMinrange) mSelection = mMinrange;
		return true;
	}
	else if (mkey == MKEY_Right || mkey == MKEY_Enter)
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/change", snd_menuvolume, ATTN_NONE);
		if ((mSelection += mStep) > mMaxrange) mSelection = mMaxrange;
		return true;
	}
	return false;
}